

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O3

uint * calculate_check_symbols(uint *M,uint m_len,uint *G,uint g_len,uint t,uint *new_len)

{
  uint alen;
  uint *puVar1;
  uint *b;
  uint *puVar2;
  uint blen;
  uint r_len;
  uint local_2c;
  
  if (m_len == t * 2) {
    puVar1 = gf_polydiv(M,m_len,G,g_len,new_len);
    return puVar1;
  }
  local_2c = 0;
  puVar1 = gf_polydiv(M,m_len,G,g_len,&local_2c);
  alen = local_2c;
  blen = m_len - local_2c;
  b = (uint *)calloc((ulong)blen,4);
  puVar2 = stack(puVar1,alen,b,blen,new_len);
  free(b);
  free(puVar1);
  return puVar2;
}

Assistant:

uint32_t *calculate_check_symbols(uint32_t *M, uint32_t m_len, uint32_t *G, uint32_t g_len, uint32_t t, uint32_t *new_len)
{
    uint32_t a_len = m_len - 2 * t;
    if (a_len <= 0)
        return gf_polydiv(M, m_len, G, g_len, new_len);

    uint32_t r_len = 0;
    uint32_t *r = gf_polydiv(M, m_len, G, g_len, &r_len);

    uint32_t *a = vector_new(a_len + (2*t-r_len));
    
    uint32_t *v = stack(r, r_len, a, a_len + (2*t-r_len), new_len);

    vector_free(a);
    vector_free(r);

    return v;
}